

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void text_client_senditup(t_text_client *x)

{
  anon_union_8_2_d3a68b8d_for_gs_un *paVar1;
  int iVar2;
  t_textbuf *x_00;
  t_template *ptVar3;
  _inlet *x_01;
  t_gstub *ptVar4;
  
  if (x->tc_sym != (t_symbol *)0x0) {
    x_00 = (t_textbuf *)pd_findbyclass(x->tc_sym,text_define_class);
    if (x_00 != (t_textbuf *)0x0) {
      textbuf_senditup(x_00);
      return;
    }
    bug("text_client_senditup");
    return;
  }
  if (x->tc_struct == (t_symbol *)0x0) {
    return;
  }
  ptVar3 = template_findbyname(x->tc_struct);
  if (ptVar3 != (t_template *)0x0) {
    ptVar4 = (x->tc_gp).gp_stub;
    iVar2 = gpointer_check(&x->tc_gp,0);
    if (iVar2 != 0) {
      if (ptVar4->gs_which == 1) {
        x_01 = (_inlet *)(x->tc_gp).gp_un.gp_scalar;
      }
      else {
        do {
          paVar1 = &ptVar4->gs_un;
          ptVar4 = (t_gstub *)paVar1->gs_glist->gl_list;
        } while (ptVar4->gs_which == 2);
        x_01 = (paVar1->gs_glist->gl_obj).te_inlet;
      }
      scalar_redraw((t_scalar *)x_01,(ptVar4->gs_un).gs_glist);
      return;
    }
    pd_error(x,"text: stale or empty pointer");
    return;
  }
  pd_error(x,"text: couldn\'t find struct %s",x->tc_struct->s_name);
  return;
}

Assistant:

static  void text_client_senditup(t_text_client *x)
{
    if (x->tc_sym)       /* named text object */
    {
        t_textbuf *y = (t_textbuf *)pd_findbyclass(x->tc_sym,
            text_define_class);
        if (y)
            textbuf_senditup(y);
        else bug("text_client_senditup");
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        if (!template)
        {
            pd_error(x, "text: couldn't find struct %s", x->tc_struct->s_name);
            return;
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "text: stale or empty pointer");
            return;
        }
        if (gs->gs_which == GP_GLIST)
            scalar_redraw(x->tc_gp.gp_un.gp_scalar, gs->gs_un.gs_glist);
        else
        {
            t_array *owner_array = gs->gs_un.gs_array;
            while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
                owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
            scalar_redraw(owner_array->a_gp.gp_un.gp_scalar,
                owner_array->a_gp.gp_stub->gs_un.gs_glist);
        }
    }
}